

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void kwssys::SystemTools::AddTranslationPath(string *a,string *b)

{
  undefined1 uVar1;
  undefined1 uVar2;
  __type _Var3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  string *in_RSI;
  string *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar7;
  string path_b;
  string path_a;
  string *in_stack_00001008;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  value_type *in_stack_ffffffffffffff38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  undefined6 in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffffb0;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30,in_RDI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,local_10);
  ConvertToUnixSlashes(in_stack_ffffffffffffffb0);
  ConvertToUnixSlashes(in_stack_ffffffffffffffb0);
  uVar1 = FileIsDirectory(in_stack_00001008);
  if ((((bool)uVar1) &&
      (uVar2 = FileIsFullPath((string *)
                              CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)),
      (bool)uVar2)) &&
     (lVar4 = std::__cxx11::string::find(&stack0xffffffffffffffb0,0x1e4d83), lVar4 == -1)) {
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 != '/')) {
      std::__cxx11::string::operator+=(local_30,'/');
    }
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 != '/')) {
      std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb0,'/');
    }
    _Var3 = std::operator==(in_stack_ffffffffffffff50,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff48)));
    if (!_Var3) {
      this = SystemToolsStatics;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (SystemToolsStatics,&in_stack_ffffffffffffff38->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      pVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this,in_stack_ffffffffffffff38);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT17(pVar7.second,in_stack_ffffffffffffff30));
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SystemTools::AddTranslationPath(const std::string& a,
                                     const std::string& b)
{
  std::string path_a = a;
  std::string path_b = b;
  SystemTools::ConvertToUnixSlashes(path_a);
  SystemTools::ConvertToUnixSlashes(path_b);
  // First check this is a directory path, since we don't want the table to
  // grow too fat
  if (SystemTools::FileIsDirectory(path_a)) {
    // Make sure the path is a full path and does not contain no '..'
    // Ken--the following code is incorrect. .. can be in a valid path
    // for example  /home/martink/MyHubba...Hubba/Src
    if (SystemTools::FileIsFullPath(path_b) &&
        path_b.find("..") == std::string::npos) {
      // Before inserting make sure path ends with '/'
      if (!path_a.empty() && path_a.back() != '/') {
        path_a += '/';
      }
      if (!path_b.empty() && path_b.back() != '/') {
        path_b += '/';
      }
      if (!(path_a == path_b)) {
        SystemToolsStatics->TranslationMap.insert(
          SystemToolsStatic::StringMap::value_type(std::move(path_a),
                                                   std::move(path_b)));
      }
    }
  }
}